

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O2

FunctionDefinitionPtr __thiscall Jinx::Impl::Runtime::FindFunction(Runtime *this,RuntimeID id)

{
  const_iterator cVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  FunctionDefinitionPtr FVar2;
  key_type local_28;
  
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(id + 0x1090))->__data);
  cVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>_>
          ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>_>
                  *)(id + 0x10b8),&local_28);
  if (cVar1._M_node == (_Base_ptr)(id + 0x10c8)) {
    (this->super_IRuntime)._vptr_IRuntime = (_func_int **)0x0;
    (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
    super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    std::__shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2> *)
               &cVar1._M_node[1]._M_parent);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(id + 0x1090));
  FVar2.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  FVar2.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (FunctionDefinitionPtr)
         FVar2.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t FunctionDefinitionPtr Runtime::FindFunction(RuntimeID id) const
	{
		std::lock_guard<std::mutex> lock(m_functionMutex);
		auto itr = m_functionMap.find(id);
		if (itr == m_functionMap.end())
			return nullptr;
		return itr->second;
	}